

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_wrapper.cpp
# Opt level: O0

ssize_t __thiscall
YAML::ostream_wrapper::write(ostream_wrapper *this,int __fd,void *__buf,size_t __n)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __result;
  bool bVar1;
  long lVar2;
  undefined7 extraout_var;
  reference pcVar3;
  undefined4 in_register_00000034;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  undefined1 *local_20;
  size_type local_18;
  undefined8 local_10;
  ostream_wrapper *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  if (this->m_pStream == (ostream *)0x0) {
    local_18 = std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
    in_stack_ffffffffffffff78 = (vector<char,_std::allocator<char>_> *)this->m_pos;
    lVar2 = std::__cxx11::string::size();
    local_20 = &(in_stack_ffffffffffffff78->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                .field_0x1 + lVar2;
    std::max<unsigned_long>(&local_18,(unsigned_long *)&local_20);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffffa0._M_current,
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
              (in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
    __result._M_current._7_1_ = in_stack_ffffffffffffff9f;
    __result._M_current._0_7_ = in_stack_ffffffffffffff98;
    std::
    copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,__result);
  }
  else {
    in_stack_ffffffffffffff80 = this->m_pStream;
    lVar2 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write((char *)in_stack_ffffffffffffff80,lVar2);
  }
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&stack0xffffffffffffffa8);
    update_pos(this,*pcVar3);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffa8);
  }
  return CONCAT71(extraout_var,bVar1);
}

Assistant:

void ostream_wrapper::write(const std::string& str) {
  if (m_pStream) {
    m_pStream->write(str.c_str(), str.size());
  } else {
    m_buffer.resize(std::max(m_buffer.size(), m_pos + str.size() + 1));
    std::copy(str.begin(), str.end(), m_buffer.begin() + m_pos);
  }

  for (char ch : str) {
    update_pos(ch);
  }
}